

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nl-reader.h
# Opt level: O0

void __thiscall
mp::internal::NLReader<mp::internal::TextReader<fmt::Locale>,TestNLHandler3>::
ReadInitialValues<mp::internal::NLReader<mp::internal::TextReader<fmt::Locale>,TestNLHandler3>::VarHandler>
          (NLReader<mp::internal::TextReader<fmt::Locale>,_TestNLHandler3> *this)

{
  CStringRef arg0;
  int iVar1;
  int iVar2;
  undefined8 *in_RDI;
  int index;
  int i;
  VarHandler vh;
  int num_values;
  undefined4 in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffbc;
  VarHandler *in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffd0;
  uint ub;
  BasicCStringRef<char> in_stack_ffffffffffffffe0;
  ItemHandler<(mp::internal::NLReader<mp::internal::TextReader<fmt::Locale>,_TestNLHandler3>::ItemType)0>
  in_stack_ffffffffffffffe8;
  undefined4 in_stack_fffffffffffffff0;
  int iVar3;
  
  iVar1 = TextReader<fmt::Locale>::ReadUInt((TextReader<fmt::Locale> *)0x24ca3b);
  NLReader<mp::internal::TextReader<fmt::Locale>,_TestNLHandler3>::VarHandler::VarHandler
            (in_stack_ffffffffffffffc0,
             (NLReader<mp::internal::TextReader<fmt::Locale>,_TestNLHandler3> *)
             CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8));
  iVar3 = iVar1;
  iVar2 = NLReader<mp::internal::TextReader<fmt::Locale>,_TestNLHandler3>::VarHandler::num_items
                    ((VarHandler *)&stack0xffffffffffffffe8);
  if (iVar2 < iVar1) {
    in_stack_ffffffffffffffc0 = (VarHandler *)*in_RDI;
    fmt::BasicCStringRef<char>::BasicCStringRef
              ((BasicCStringRef<char> *)&stack0xffffffffffffffe0,"too many initial values");
    arg0.data_._4_4_ = iVar3;
    arg0.data_._0_4_ = in_stack_fffffffffffffff0;
    TextReader<fmt::Locale>::ReportError<>
              ((TextReader<fmt::Locale> *)in_stack_ffffffffffffffe8.reader_,arg0);
  }
  TextReader<fmt::Locale>::ReadTillEndOfLine
            ((TextReader<fmt::Locale> *)in_stack_ffffffffffffffe0.data_);
  for (ub = 0; (int)ub < iVar3; ub = ub + 1) {
    NLReader<mp::internal::TextReader<fmt::Locale>,_TestNLHandler3>::VarHandler::num_items
              ((VarHandler *)&stack0xffffffffffffffe8);
    iVar2 = NLReader<mp::internal::TextReader<fmt::Locale>,_TestNLHandler3>::ReadUInt
                      ((NLReader<mp::internal::TextReader<fmt::Locale>,_TestNLHandler3> *)
                       in_stack_ffffffffffffffe0.data_,ub);
    TextReader<fmt::Locale>::ReadDouble
              ((TextReader<fmt::Locale> *)CONCAT44(iVar1,in_stack_ffffffffffffffd0));
    NLReader<mp::internal::TextReader<fmt::Locale>,_TestNLHandler3>::VarHandler::SetInitialValue
              (in_stack_ffffffffffffffc0,iVar2,1.19131727073164e-317);
    TextReader<fmt::Locale>::ReadTillEndOfLine
              ((TextReader<fmt::Locale> *)in_stack_ffffffffffffffe0.data_);
  }
  return;
}

Assistant:

void NLReader<Reader, Handler>::ReadInitialValues() {
  int num_values = reader_.ReadUInt();
  ValueHandler vh(*this);
  if (num_values > vh.num_items())
    reader_.ReportError("too many initial values");
  reader_.ReadTillEndOfLine();
  for (int i = 0; i < num_values; ++i) {
    int index = ReadUInt(vh.num_items());
    vh.SetInitialValue(index, reader_.ReadDouble());
    reader_.ReadTillEndOfLine();
  }
}